

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ungetc.c
# Opt level: O3

int ungetc(int __c,FILE *__stream)

{
  char *pcVar1;
  uint uVar2;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  uVar2 = 0xffffffff;
  if ((__c != -1) && (pcVar1 = __stream->_IO_buf_base, pcVar1 != (char *)0x1)) {
    __stream->_IO_buf_base = pcVar1 + 1;
    *(char *)((long)&__stream->_IO_buf_end + (long)pcVar1) = (char)__c;
    uVar2 = __c & 0xff;
  }
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return uVar2;
}

Assistant:

int ungetc( int c, struct _PDCLIB_file_t * stream )
{
    int rc;

    _PDCLIB_LOCK( stream->mtx );

    if ( c == EOF || stream->ungetidx == _PDCLIB_UNGETCBUFSIZE )
    {
        rc = -1;
    }
    else
    {
        rc = stream->ungetbuf[stream->ungetidx++] = ( unsigned char ) c;
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return rc;
}